

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessauthenticationmanager.cpp
# Opt level: O0

QByteArray * authenticationKey(QUrl *url,QString *realm)

{
  ParsingMode in_EDX;
  QUrl *in_RSI;
  QStringBuilder<const_char_(&)[6],_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  QUrl copy;
  QStringBuilder<const_char_(&)[6],_QByteArray> *b;
  undefined1 local_48 [24];
  char local_30 [32];
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  b = in_RDI;
  QUrl::QUrl(&local_10,in_RSI);
  QUrl::setFragment((QString *)&local_10,in_EDX);
  operator|((UrlFormattingOption)((ulong)b >> 0x20),(UrlFormattingOption)b);
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|
            ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)b,
             (UrlFormattingOption)((ulong)in_RDI >> 0x20));
  QUrl::toEncoded((QUrlTwoFlags_conflict1 *)local_48);
  operator+((char (*) [6])local_30,(QByteArray *)b);
  QStringBuilder::operator_cast_to_QByteArray(in_RDI);
  QStringBuilder<const_char_(&)[6],_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[6],_QByteArray> *)0x182eef);
  QByteArray::~QByteArray((QByteArray *)0x182ef9);
  QUrl::~QUrl(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QByteArray authenticationKey(const QUrl &url, const QString &realm)
{
    QUrl copy = url;
    copy.setFragment(realm);
    return "auth:" + copy.toEncoded(QUrl::RemovePassword | QUrl::RemovePath | QUrl::RemoveQuery);
}